

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_opt.c
# Opt level: O3

U32 ZSTD_insertBt1(ZSTD_matchState_t *ms,BYTE *ip,BYTE *iend,U32 mls,int extDict)

{
  ulong *ip_00;
  BYTE *pBVar1;
  uint uVar2;
  uint uVar3;
  BYTE *pBVar4;
  long lVar5;
  size_t sVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong *puVar10;
  uint *puVar11;
  char cVar12;
  long lVar13;
  ulong *puVar14;
  uint *puVar15;
  ulong uVar16;
  uint uVar17;
  uint uVar18;
  ulong uVar19;
  uint uVar20;
  BYTE *pBVar21;
  uint uVar22;
  bool bVar23;
  U32 dummy32;
  BYTE *pInLoopLimit;
  int local_e4;
  uint *local_d8;
  uint local_ac;
  BYTE *local_a8;
  U32 *local_a0;
  BYTE *local_98;
  ulong *local_90;
  ulong local_88;
  ulong local_80;
  BYTE *local_78;
  ulong local_70;
  ulong *local_68;
  ulong *local_60;
  ulong *local_58;
  BYTE *local_50;
  BYTE *local_48;
  ulong local_40;
  BYTE *local_38;
  
  cVar12 = (char)(ms->cParams).hashLog;
  switch(mls) {
  case 5:
    lVar13 = -0x30e4432345000000;
    break;
  case 6:
    lVar13 = -0x30e4432340650000;
    break;
  case 7:
    lVar13 = -0x30e44323405a9d00;
    break;
  case 8:
    lVar13 = -0x30e44323485a9b9d;
    break;
  default:
    uVar19 = (ulong)((uint)(*(int *)ip * -0x61c8864f) >> (-cVar12 & 0x1fU));
    goto LAB_001364d1;
  }
  uVar19 = (ulong)(lVar13 * *(long *)ip) >> (-cVar12 & 0x3fU);
LAB_001364d1:
  local_a0 = ms->chainTable;
  uVar22 = ~(-1 << ((char)(ms->cParams).chainLog - 1U & 0x1f));
  uVar18 = ms->hashTable[uVar19];
  pBVar4 = (ms->window).base;
  local_38 = (ms->window).dictBase;
  uVar16 = (ulong)(ms->window).dictLimit;
  uVar20 = (int)ip - (int)pBVar4;
  local_70 = (ulong)uVar20;
  uVar17 = uVar20 - uVar22;
  if (uVar20 < uVar22) {
    uVar17 = 0;
  }
  uVar7 = (ulong)((uVar20 & uVar22) * 2);
  uVar2 = (ms->window).lowLimit;
  uVar3 = (ms->cParams).searchLog;
  ms->hashTable[uVar19] = uVar20;
  local_d8 = local_a0 + uVar7;
  local_e4 = uVar20 + 9;
  if (uVar18 < uVar2) {
    local_d8[0] = 0;
    local_d8[1] = 0;
    local_70._0_4_ = uVar20;
LAB_00136872:
    return (local_e4 - (uint)local_70) - 8;
  }
  local_48 = local_38 + uVar16;
  local_50 = pBVar4 + uVar16;
  puVar15 = local_a0 + uVar7 + 1;
  uVar20 = ~(-1 << ((byte)uVar3 & 0x1f));
  local_58 = (ulong *)(iend + -7);
  local_60 = (ulong *)(iend + -3);
  local_68 = (ulong *)(iend + -1);
  local_a8 = pBVar4 + 8;
  local_78 = ip + 8;
  uVar19 = 8;
  local_88 = 0;
  local_80 = 0;
  local_98 = ip;
  local_90 = (ulong *)iend;
LAB_00136601:
  uVar9 = (ulong)uVar18;
  uVar7 = local_80;
  if (local_88 < local_80) {
    uVar7 = local_88;
  }
  uVar8 = uVar7 + uVar9;
  ip_00 = (ulong *)(local_98 + uVar7);
  if ((extDict == 0) || (uVar16 <= uVar8)) {
    pBVar21 = pBVar4 + uVar9;
    puVar14 = (ulong *)(pBVar21 + uVar7);
    puVar10 = ip_00;
    if (ip_00 < local_58) {
      if (*puVar14 == *ip_00) {
        lVar13 = 0;
        do {
          puVar10 = (ulong *)(local_78 + lVar13 + uVar7);
          if (local_58 <= puVar10) {
            puVar14 = (ulong *)(local_a8 + uVar8 + lVar13);
            goto LAB_00136716;
          }
          lVar5 = lVar13 + uVar8;
          lVar13 = lVar13 + 8;
        } while (*(ulong *)(local_a8 + lVar5) == *puVar10);
        uVar8 = *puVar10 ^ *(ulong *)(local_a8 + lVar5);
        uVar9 = 0;
        if (uVar8 != 0) {
          for (; (uVar8 >> uVar9 & 1) == 0; uVar9 = uVar9 + 1) {
          }
        }
        uVar9 = (uVar9 >> 3 & 0x1fffffff) + lVar13;
      }
      else {
        uVar8 = *ip_00 ^ *puVar14;
        uVar9 = 0;
        if (uVar8 != 0) {
          for (; (uVar8 >> uVar9 & 1) == 0; uVar9 = uVar9 + 1) {
          }
        }
        uVar9 = uVar9 >> 3 & 0x1fffffff;
      }
    }
    else {
LAB_00136716:
      if ((puVar10 < local_60) && ((int)*puVar14 == (int)*puVar10)) {
        puVar10 = (ulong *)((long)puVar10 + 4);
        puVar14 = (ulong *)((long)puVar14 + 4);
      }
      if ((puVar10 < local_68) && ((short)*puVar14 == (short)*puVar10)) {
        puVar10 = (ulong *)((long)puVar10 + 2);
        puVar14 = (ulong *)((long)puVar14 + 2);
      }
      if (puVar10 < local_90) {
        puVar10 = (ulong *)((long)puVar10 + (ulong)((byte)*puVar14 == (byte)*puVar10));
      }
      uVar9 = (long)puVar10 - (long)ip_00;
    }
    uVar7 = uVar9 + uVar7;
  }
  else {
    pBVar1 = local_38 + uVar9;
    local_40 = uVar9;
    sVar6 = ZSTD_count_2segments((BYTE *)ip_00,pBVar1 + uVar7,(BYTE *)local_90,local_48,local_50);
    uVar7 = sVar6 + uVar7;
    pBVar21 = pBVar4 + uVar9;
    if (uVar7 + uVar9 < uVar16) {
      pBVar21 = pBVar1;
    }
    uVar18 = (uint)local_40;
  }
  if ((uVar19 < uVar7) && (uVar19 = uVar7, local_e4 - uVar18 < uVar7)) {
    local_e4 = uVar18 + (int)uVar7;
  }
  if ((ulong *)(local_98 + uVar7) == local_90) goto LAB_00136846;
  puVar11 = local_a0 + (uVar18 & uVar22) * 2;
  if (pBVar21[uVar7] < (byte)*(ulong *)(local_98 + uVar7)) {
    *local_d8 = uVar18;
    if (uVar18 <= uVar17) {
      local_d8 = &local_ac;
LAB_00136846:
      *puVar15 = 0;
      *local_d8 = 0;
      if (0x180 < uVar19) {
        uVar18 = (int)uVar19 - 0x180;
        if (uVar18 < 0xc0) {
          return uVar18;
        }
        return 0xc0;
      }
      goto LAB_00136872;
    }
    puVar11 = puVar11 + 1;
    local_d8 = puVar11;
    local_88 = uVar7;
  }
  else {
    *puVar15 = uVar18;
    puVar15 = puVar11;
    local_80 = uVar7;
    if (uVar18 <= uVar17) {
      puVar15 = &local_ac;
      goto LAB_00136846;
    }
  }
  bVar23 = uVar20 == 0;
  uVar20 = uVar20 - 1;
  if ((bVar23) || (uVar18 = *puVar11, uVar18 < uVar2)) goto LAB_00136846;
  goto LAB_00136601;
}

Assistant:

static U32 ZSTD_insertBt1(
                ZSTD_matchState_t* ms,
                const BYTE* const ip, const BYTE* const iend,
                U32 const mls, const int extDict)
{
    const ZSTD_compressionParameters* const cParams = &ms->cParams;
    U32*   const hashTable = ms->hashTable;
    U32    const hashLog = cParams->hashLog;
    size_t const h  = ZSTD_hashPtr(ip, hashLog, mls);
    U32*   const bt = ms->chainTable;
    U32    const btLog  = cParams->chainLog - 1;
    U32    const btMask = (1 << btLog) - 1;
    U32 matchIndex = hashTable[h];
    size_t commonLengthSmaller=0, commonLengthLarger=0;
    const BYTE* const base = ms->window.base;
    const BYTE* const dictBase = ms->window.dictBase;
    const U32 dictLimit = ms->window.dictLimit;
    const BYTE* const dictEnd = dictBase + dictLimit;
    const BYTE* const prefixStart = base + dictLimit;
    const BYTE* match;
    const U32 current = (U32)(ip-base);
    const U32 btLow = btMask >= current ? 0 : current - btMask;
    U32* smallerPtr = bt + 2*(current&btMask);
    U32* largerPtr  = smallerPtr + 1;
    U32 dummy32;   /* to be nullified at the end */
    U32 const windowLow = ms->window.lowLimit;
    U32 matchEndIdx = current+8+1;
    size_t bestLength = 8;
    U32 nbCompares = 1U << cParams->searchLog;
#ifdef ZSTD_C_PREDICT
    U32 predictedSmall = *(bt + 2*((current-1)&btMask) + 0);
    U32 predictedLarge = *(bt + 2*((current-1)&btMask) + 1);
    predictedSmall += (predictedSmall>0);
    predictedLarge += (predictedLarge>0);
#endif /* ZSTD_C_PREDICT */

    DEBUGLOG(8, "ZSTD_insertBt1 (%u)", current);

    assert(ip <= iend-8);   /* required for h calculation */
    hashTable[h] = current;   /* Update Hash Table */

    assert(windowLow > 0);
    while (nbCompares-- && (matchIndex >= windowLow)) {
        U32* const nextPtr = bt + 2*(matchIndex & btMask);
        size_t matchLength = MIN(commonLengthSmaller, commonLengthLarger);   /* guaranteed minimum nb of common bytes */
        assert(matchIndex < current);

#ifdef ZSTD_C_PREDICT   /* note : can create issues when hlog small <= 11 */
        const U32* predictPtr = bt + 2*((matchIndex-1) & btMask);   /* written this way, as bt is a roll buffer */
        if (matchIndex == predictedSmall) {
            /* no need to check length, result known */
            *smallerPtr = matchIndex;
            if (matchIndex <= btLow) { smallerPtr=&dummy32; break; }   /* beyond tree size, stop the search */
            smallerPtr = nextPtr+1;               /* new "smaller" => larger of match */
            matchIndex = nextPtr[1];              /* new matchIndex larger than previous (closer to current) */
            predictedSmall = predictPtr[1] + (predictPtr[1]>0);
            continue;
        }
        if (matchIndex == predictedLarge) {
            *largerPtr = matchIndex;
            if (matchIndex <= btLow) { largerPtr=&dummy32; break; }   /* beyond tree size, stop the search */
            largerPtr = nextPtr;
            matchIndex = nextPtr[0];
            predictedLarge = predictPtr[0] + (predictPtr[0]>0);
            continue;
        }
#endif

        if (!extDict || (matchIndex+matchLength >= dictLimit)) {
            assert(matchIndex+matchLength >= dictLimit);   /* might be wrong if actually extDict */
            match = base + matchIndex;
            matchLength += ZSTD_count(ip+matchLength, match+matchLength, iend);
        } else {
            match = dictBase + matchIndex;
            matchLength += ZSTD_count_2segments(ip+matchLength, match+matchLength, iend, dictEnd, prefixStart);
            if (matchIndex+matchLength >= dictLimit)
                match = base + matchIndex;   /* to prepare for next usage of match[matchLength] */
        }

        if (matchLength > bestLength) {
            bestLength = matchLength;
            if (matchLength > matchEndIdx - matchIndex)
                matchEndIdx = matchIndex + (U32)matchLength;
        }

        if (ip+matchLength == iend) {   /* equal : no way to know if inf or sup */
            break;   /* drop , to guarantee consistency ; miss a bit of compression, but other solutions can corrupt tree */
        }

        if (match[matchLength] < ip[matchLength]) {  /* necessarily within buffer */
            /* match is smaller than current */
            *smallerPtr = matchIndex;             /* update smaller idx */
            commonLengthSmaller = matchLength;    /* all smaller will now have at least this guaranteed common length */
            if (matchIndex <= btLow) { smallerPtr=&dummy32; break; }   /* beyond tree size, stop searching */
            smallerPtr = nextPtr+1;               /* new "candidate" => larger than match, which was smaller than target */
            matchIndex = nextPtr[1];              /* new matchIndex, larger than previous and closer to current */
        } else {
            /* match is larger than current */
            *largerPtr = matchIndex;
            commonLengthLarger = matchLength;
            if (matchIndex <= btLow) { largerPtr=&dummy32; break; }   /* beyond tree size, stop searching */
            largerPtr = nextPtr;
            matchIndex = nextPtr[0];
    }   }

    *smallerPtr = *largerPtr = 0;
    if (bestLength > 384) return MIN(192, (U32)(bestLength - 384));   /* speed optimization */
    assert(matchEndIdx > current + 8);
    return matchEndIdx - (current + 8);
}